

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall ParseInt16_SignedAndUnsigned_Test::TestBody(ParseInt16_SignedAndUnsigned_Test *this)

{
  anon_unknown.dwarf_90916::AssertInt16Equals(0x8000,"-32768",SignedAndUnsigned);
  anon_unknown.dwarf_90916::AssertInt16Equals(0x8000,"-0x8000",SignedAndUnsigned);
  anon_unknown.dwarf_90916::AssertInt16Equals(0xffff,"-1",SignedAndUnsigned);
  anon_unknown.dwarf_90916::AssertInt16Equals(0xffff,"-0x1",SignedAndUnsigned);
  anon_unknown.dwarf_90916::AssertInt16Equals(1,"+1",SignedAndUnsigned);
  anon_unknown.dwarf_90916::AssertInt16Equals(0x8433,"-0x7BCD",SignedAndUnsigned);
  anon_unknown.dwarf_90916::AssertInt16Equals(0xabcd,"+0xabcd",SignedAndUnsigned);
  return;
}

Assistant:

TEST(ParseInt16, SignedAndUnsigned) {
  AssertInt16Equals(32768, "-32768", SignedAndUnsigned);
  AssertInt16Equals(-0x8000, "-0x8000", SignedAndUnsigned);
  AssertInt16Equals(65535, "-1", SignedAndUnsigned);
  AssertInt16Equals(-1, "-0x1", SignedAndUnsigned);
  AssertInt16Equals(1, "+1", SignedAndUnsigned);
  AssertInt16Equals(-0x7bcd, "-0x7BCD", SignedAndUnsigned);
  AssertInt16Equals(0xabcd, "+0xabcd", SignedAndUnsigned);
}